

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamepad.c
# Opt level: O0

void wpe_gamepad_provider_destroy(wpe_gamepad_provider *provider)

{
  wpe_gamepad_provider *provider_local;
  
  if (provider != (wpe_gamepad_provider *)0x0) {
    if ((provider_interface != (wpe_gamepad_provider_interface *)0x0) &&
       (provider_interface->destroy != (_func_void_void_ptr *)0x0)) {
      (*provider_interface->destroy)(provider->backend);
    }
    provider->backend = (void *)0x0;
    free(provider);
  }
  return;
}

Assistant:

void
wpe_gamepad_provider_destroy(struct wpe_gamepad_provider* provider)
{
    if (!provider)
        return;

    if (provider_interface && provider_interface->destroy)
        provider_interface->destroy(provider->backend);
    provider->backend = NULL;
    wpe_free(provider);
}